

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Algorithms.h
# Opt level: O0

uint ** ADS::Algorithms<unsigned_int>::dijskstra(Graph<unsigned_int> *pGraph,PQueue *pQueue)

{
  uint uVar1;
  uint **ppuVar2;
  uint *puVar3;
  uint local_24;
  uint i;
  uint **ppDistances;
  PQueue *pQueue_local;
  Graph<unsigned_int> *pGraph_local;
  
  uVar1 = Graph<unsigned_int>::getVertexCount(pGraph);
  ppuVar2 = (uint **)allocateArray(uVar1,8);
  local_24 = 0;
  while( true ) {
    uVar1 = Graph<unsigned_int>::getVertexCount(pGraph);
    if (uVar1 <= local_24) break;
    puVar3 = dijskstra(pGraph,local_24,pQueue);
    ppuVar2[local_24] = puVar3;
    local_24 = local_24 + 1;
  }
  return ppuVar2;
}

Assistant:

T ** Algorithms<T>::dijskstra (Graph<T> *pGraph, PQueue *pQueue)
    {
        T **ppDistances = static_cast<T**>(allocateArray (pGraph->getVertexCount(), sizeof (T *)));
        for (unsigned int i = 0; i < pGraph->getVertexCount(); i++)
            ppDistances[i] = dijskstra (pGraph, i, pQueue);
        return ppDistances;
    }